

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModel.cpp
# Opt level: O1

void __thiscall
chrono::collision::ChCollisionModel::SetAllShapesMaterial
          (ChCollisionModel *this,shared_ptr<chrono::ChMaterialSurface> *mat)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  pointer psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar3;
  int iVar4;
  pointer psVar5;
  
  psVar5 = (this->m_shapes).
           super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->m_shapes).
                          super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)psVar5) >> 4) != 0) {
    iVar3 = (**(code **)(**(long **)&(((psVar5->
                                       super___shared_ptr<chrono::collision::ChCollisionShape,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr)->m_material).
                                     super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                        + 0x18))();
    iVar4 = (*((mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->_vptr_ChMaterialSurface[3])();
    if (iVar3 != iVar4) {
      __assert_fail("GetNumShapes() == 0 || m_shapes[0]->m_material->GetContactMethod() == mat->GetContactMethod()"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/ChCollisionModel.cpp"
                    ,0xa4,
                    "void chrono::collision::ChCollisionModel::SetAllShapesMaterial(std::shared_ptr<ChMaterialSurface>)"
                   );
    }
  }
  psVar5 = (this->m_shapes).
           super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->m_shapes).
           super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar5 != psVar1) {
    __r = &(mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount;
    do {
      peVar2 = (psVar5->
               super___shared_ptr<chrono::collision::ChCollisionShape,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      this_00 = (psVar5->
                super___shared_ptr<chrono::collision::ChCollisionShape,_(__gnu_cxx::_Lock_policy)2>)
                ._M_refcount._M_pi;
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (peVar2->m_material).
        super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(peVar2->m_material).
                    super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,__r);
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        (peVar2->m_material).
        super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(peVar2->m_material).
                    super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,__r);
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
      }
      psVar5 = psVar5 + 1;
    } while (psVar5 != psVar1);
  }
  return;
}

Assistant:

void ChCollisionModel::SetAllShapesMaterial(std::shared_ptr<ChMaterialSurface> mat) {
    assert(GetNumShapes() == 0 || m_shapes[0]->m_material->GetContactMethod() == mat->GetContactMethod());
    for (auto shape : m_shapes)
        shape->m_material = mat;
}